

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O0

void gnilk::Logger::AddSink
               (Ref *sink,string *name,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *argv)

{
  element_type *peVar1;
  shared_ptr<gnilk::LogSink> local_30;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_20;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *argv_local;
  string *name_local;
  Ref *sink_local;
  
  local_20 = argv;
  argv_local = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)name;
  name_local = (string *)sink;
  peVar1 = std::__shared_ptr_access<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)sink);
  (*peVar1->_vptr_LogSink[3])(peVar1,local_20);
  std::shared_ptr<gnilk::LogSink>::shared_ptr(&local_30,sink);
  AddSink(&local_30,(string *)argv_local);
  std::shared_ptr<gnilk::LogSink>::~shared_ptr(&local_30);
  return;
}

Assistant:

void Logger::AddSink(LogSink::Ref sink, const std::string &name, const std::vector<std::string_view> &argv) {
    sink->Initialize(argv);
    AddSink(sink,name);
}